

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IGeneratorsForTest * Catch::createGeneratorsForTest(void)

{
  IGeneratorsForTest *pIVar1;
  
  pIVar1 = (IGeneratorsForTest *)operator_new(0x50);
  pIVar1->_vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[1]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[2]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[3]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[4]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[5]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[6]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[7]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[8]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[9]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1->_vptr_IGeneratorsForTest = (_func_int **)&PTR__GeneratorsForTest_0018cf88;
  *(undefined4 *)&pIVar1[2]._vptr_IGeneratorsForTest = 0;
  pIVar1[3]._vptr_IGeneratorsForTest = (_func_int **)0x0;
  pIVar1[4]._vptr_IGeneratorsForTest = (_func_int **)(pIVar1 + 2);
  pIVar1[5]._vptr_IGeneratorsForTest = (_func_int **)(pIVar1 + 2);
  return pIVar1;
}

Assistant:

IGeneratorsForTest* createGeneratorsForTest()
    {
        return new GeneratorsForTest();
    }